

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

BIGNUM * BN_copy(BIGNUM *a,BIGNUM *b)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  ulong *puVar4;
  ulong *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  BIGNUM *pBVar9;
  long lVar10;
  int iVar11;
  
  if (a != b) {
    pBVar9 = bn_wexpand((BIGNUM *)a,b->top);
    if (pBVar9 == (BIGNUM *)0x0) {
      a = (BIGNUM *)0x0;
    }
    else {
      puVar4 = a->d;
      puVar5 = b->d;
      uVar3 = b->top;
      lVar10 = 0x10;
      for (iVar11 = (int)uVar3 >> 2; 0 < iVar11; iVar11 = iVar11 + -1) {
        puVar1 = (undefined8 *)((long)puVar5 + lVar10 + -0x10);
        uVar6 = puVar1[1];
        uVar7 = *(undefined8 *)((long)puVar5 + lVar10);
        uVar8 = ((undefined8 *)((long)puVar5 + lVar10))[1];
        puVar2 = (undefined8 *)((long)puVar4 + lVar10 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        *(undefined8 *)((long)puVar4 + lVar10) = uVar7;
        ((undefined8 *)((long)puVar4 + lVar10))[1] = uVar8;
        lVar10 = lVar10 + 0x20;
      }
      switch(uVar3 & 3) {
      case 3:
        *(undefined8 *)((long)puVar4 + lVar10) = *(undefined8 *)((long)puVar5 + lVar10);
      case 2:
        *(undefined8 *)((long)puVar4 + lVar10 + -8) = *(undefined8 *)((long)puVar5 + lVar10 + -8);
      case 1:
        *(undefined8 *)((long)puVar4 + lVar10 + -0x10) =
             *(undefined8 *)((long)puVar5 + lVar10 + -0x10);
      case 0:
        a->top = uVar3;
        a->neg = b->neg;
      }
    }
  }
  return a;
}

Assistant:

BIGNUM *BN_copy(BIGNUM *a, const BIGNUM *b)
{
    int i;
    BN_ULONG *A;
    const BN_ULONG *B;

    bn_check_top(b);

    if (a == b)
        return (a);
    if (bn_wexpand(a, b->top) == NULL)
        return (NULL);

    A = a->d;
    B = b->d;
    for (i = b->top >> 2; i > 0; i--, A += 4, B += 4) {
        BN_ULONG a0, a1, a2, a3;
        a0 = B[0];
        a1 = B[1];
        a2 = B[2];
        a3 = B[3];
        A[0] = a0;
        A[1] = a1;
        A[2] = a2;
        A[3] = a3;
    }
    /* ultrix cc workaround, see comments in bn_expand_internal */
    switch (b->top & 3) {
    case 3:
        A[2] = B[2];
    case 2:
        A[1] = B[1];
    case 1:
        A[0] = B[0];
    case 0:;
    }

    a->top = b->top;
    a->neg = b->neg;
    bn_check_top(a);
    return (a);
}